

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* GetDefaultMap_abi_cxx11_(void)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *in_RDI;
  pointer pbVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_04;
  allocator<char> local_1ce4;
  allocator<char> local_1ce3;
  allocator<char> local_1ce2;
  allocator<char> local_1ce1;
  allocator<char> local_1ce0;
  allocator<char> local_1cdf;
  allocator<char> local_1cde;
  allocator<char> local_1cdd;
  allocator<char> local_1cdc;
  allocator<char> local_1cdb;
  allocator<char> local_1cda;
  allocator<char> local_1cd9;
  allocator<char> local_1cd8;
  allocator<char> local_1cd7;
  allocator<char> local_1cd6;
  allocator<char> local_1cd5;
  allocator<char> local_1cd4;
  allocator<char> local_1cd3;
  allocator<char> local_1cd2;
  allocator<char> local_1cd1;
  allocator<char> local_1cd0;
  allocator<char> local_1ccf;
  allocator<char> local_1cce;
  allocator<char> local_1ccd;
  allocator<char> local_1ccc;
  allocator<char> local_1ccb;
  allocator<char> local_1cca;
  allocator<char> local_1cc9;
  allocator<char> local_1cc8;
  allocator<char> local_1cc7;
  allocator<char> local_1cc6;
  allocator<char> local_1cc5;
  allocator<char> local_1cc4;
  allocator<char> local_1cc3;
  allocator<char> local_1cc2;
  allocator<char> local_1cc1;
  allocator<char> local_1cc0;
  allocator<char> local_1cbf;
  allocator<char> local_1cbe;
  allocator<char> local_1cbd;
  allocator<char> local_1cbc;
  allocator<char> local_1cbb;
  allocator<char> local_1cba;
  allocator<char> local_1cb9;
  allocator<char> local_1cb8;
  allocator<char> local_1cb7;
  allocator<char> local_1cb6;
  allocator<char> local_1cb5;
  allocator<char> local_1cb4;
  allocator<char> local_1cb3;
  allocator<char> local_1cb2;
  allocator<char> local_1cb1;
  allocator<char> local_1cb0;
  allocator<char> local_1caf;
  allocator<char> local_1cae;
  allocator<char> local_1cad;
  allocator<char> local_1cac;
  allocator<char> local_1cab;
  allocator<char> local_1caa;
  allocator<char> local_1ca9;
  allocator<char> local_1ca8;
  allocator<char> local_1ca7;
  allocator<char> local_1ca6;
  allocator<char> local_1ca5;
  allocator<char> local_1ca4;
  allocator<char> local_1ca3;
  allocator<char> local_1ca2;
  allocator<char> local_1ca1;
  allocator<char> local_1ca0;
  allocator<char> local_1c9f;
  allocator<char> local_1c9e;
  allocator<char> local_1c9d;
  allocator<char> local_1c9c;
  allocator<char> local_1c9b;
  allocator<char> local_1c9a;
  allocator_type local_1c99;
  allocator<char> local_1c98;
  allocator<char> local_1c97;
  allocator<char> local_1c96;
  allocator<char> local_1c95;
  allocator<char> local_1c94;
  allocator<char> local_1c93;
  allocator<char> local_1c92;
  allocator<char> local_1c91;
  allocator<char> local_1c90;
  allocator<char> local_1c8f;
  allocator<char> local_1c8e;
  allocator<char> local_1c8d;
  allocator<char> local_1c8c;
  allocator<char> local_1c8b;
  allocator<char> local_1c8a;
  allocator<char> local_1c89;
  allocator<char> local_1c88;
  allocator<char> local_1c87;
  allocator<char> local_1c86;
  allocator<char> local_1c85;
  allocator<char> local_1c84;
  allocator<char> local_1c83;
  allocator<char> local_1c82;
  allocator<char> local_1c81;
  allocator<char> local_1c80;
  allocator<char> local_1c7f;
  allocator<char> local_1c7e;
  allocator<char> local_1c7d;
  allocator<char> local_1c7c;
  allocator<char> local_1c7b;
  allocator<char> local_1c7a;
  allocator<char> local_1c79;
  allocator<char> local_1c78;
  allocator<char> local_1c77;
  allocator<char> local_1c76;
  allocator<char> local_1c75;
  allocator<char> local_1c74;
  allocator<char> local_1c73;
  allocator<char> local_1c72;
  allocator<char> local_1c71;
  allocator<char> local_1c70;
  allocator<char> local_1c6f;
  allocator<char> local_1c6e;
  allocator<char> local_1c6d;
  allocator<char> local_1c6c;
  allocator<char> local_1c6b;
  allocator<char> local_1c6a;
  allocator<char> local_1c69;
  allocator<char> local_1c68;
  allocator<char> local_1c67;
  allocator<char> local_1c66;
  allocator<char> local_1c65;
  allocator<char> local_1c64;
  allocator<char> local_1c63;
  allocator<char> local_1c62;
  allocator<char> local_1c61;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_1c60;
  allocator_type local_1c57;
  allocator<char> local_1c56;
  allocator<char> local_1c55;
  allocator<char> local_1c54;
  allocator<char> local_1c53;
  allocator<char> local_1c52;
  allocator<char> local_1c51;
  allocator<char> local_1c50;
  allocator<char> local_1c4f;
  allocator<char> local_1c4e;
  allocator<char> local_1c4d;
  allocator<char> local_1c4c;
  allocator<char> local_1c4b;
  allocator<char> local_1c4a;
  allocator<char> local_1c49;
  allocator<char> local_1c48;
  allocator<char> local_1c47;
  allocator<char> local_1c46;
  allocator<char> local_1c45;
  allocator<char> local_1c44;
  allocator<char> local_1c43;
  allocator<char> local_1c42;
  allocator<char> local_1c41;
  allocator<char> local_1c40;
  allocator<char> local_1c3f;
  allocator<char> local_1c3e;
  allocator<char> local_1c3d;
  allocator<char> local_1c3c;
  allocator<char> local_1c3b;
  allocator<char> local_1c3a;
  allocator<char> local_1c39;
  allocator<char> local_1c38;
  allocator<char> local_1c37;
  allocator<char> local_1c36;
  allocator<char> local_1c35;
  allocator<char> local_1c34;
  allocator<char> local_1c33;
  allocator<char> local_1c32;
  allocator<char> local_1c31;
  allocator<char> local_1c30;
  allocator<char> local_1c2f;
  allocator<char> local_1c2e;
  allocator<char> local_1c2d;
  allocator<char> local_1c2c;
  allocator<char> local_1c2b;
  allocator<char> local_1c2a;
  allocator<char> local_1c29;
  allocator<char> local_1c28;
  allocator<char> local_1c27;
  allocator<char> local_1c26;
  allocator<char> local_1c25;
  allocator<char> local_1c24;
  allocator<char> local_1c23;
  allocator<char> local_1c22;
  allocator<char> local_1c21;
  allocator<char> local_1c20;
  allocator<char> local_1c1f;
  allocator<char> local_1c1e;
  allocator<char> local_1c1d;
  allocator<char> local_1c1c;
  allocator<char> local_1c1b;
  allocator<char> local_1c1a;
  allocator<char> local_1c19;
  allocator<char> local_1c18;
  allocator<char> local_1c17;
  allocator<char> local_1c16;
  allocator<char> local_1c15;
  allocator<char> local_1c14;
  allocator<char> local_1c13;
  allocator<char> local_1c12;
  allocator<char> local_1c11;
  allocator<char> local_1c10;
  allocator<char> local_1c0f;
  allocator<char> local_1c0e;
  allocator<char> local_1c0d;
  allocator<char> local_1c0c;
  allocator<char> local_1c0b;
  allocator<char> local_1c0a;
  allocator<char> local_1c09;
  undefined1 local_1c08 [8];
  char *local_1c00;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  es;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  is;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ns;
  undefined1 local_1b30 [32];
  string local_1b10 [16];
  undefined1 local_1b00 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ae8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ad0;
  string local_1ab0 [32];
  string local_1a90 [32];
  string local_1a70 [32];
  string local_1a50 [32];
  string local_1a30 [32];
  string local_1a10 [32];
  string local_19f0 [32];
  string local_19d0 [32];
  string local_19b0 [32];
  string local_1990 [32];
  string local_1970 [32];
  string local_1950 [32];
  string local_1930 [32];
  string local_1910 [32];
  string local_18f0 [32];
  string local_18d0 [32];
  string local_18b0 [32];
  string local_1890 [32];
  string local_1870 [32];
  string local_1850 [32];
  string local_1830 [32];
  string local_1810 [32];
  string local_17f0 [32];
  string local_17d0 [32];
  string local_17b0 [32];
  string local_1790 [32];
  string local_1770 [32];
  string local_1750 [32];
  string local_1730 [32];
  string local_1710 [32];
  string local_16f0 [32];
  string local_16d0 [32];
  string local_16b0 [32];
  string local_1690 [32];
  string local_1670 [32];
  string local_1650 [32];
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0 [32];
  string local_15d0 [32];
  string local_15b0 [32];
  string local_1590 [32];
  string local_1570 [32];
  string local_1550 [32];
  string local_1530 [32];
  string local_1510 [32];
  string local_14f0 [32];
  string local_14d0 [32];
  string local_14b0 [32];
  string local_1490 [32];
  string local_1470 [32];
  string local_1450 [32];
  string local_1430 [32];
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [32];
  string local_13b0 [32];
  string local_1390 [32];
  string local_1370 [32];
  string local_1350 [32];
  string local_1330 [32];
  string local_1310 [32];
  string local_12f0 [32];
  string local_12d0 [32];
  string local_12b0 [32];
  string local_1290 [32];
  string local_1270 [32];
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string local_11d0 [32];
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  string local_bd0 [32];
  string local_bb0 [32];
  string local_b90 [32];
  string local_b70 [32];
  string local_b50 [32];
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [32];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = "/[()[]]/";
  local_1c60 = in_RDI;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = anon_var_dwarf_1373e;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_1c60,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = "|\\|";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_1c60,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = anon_var_dwarf_13754;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_1c60,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = "/IJ";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_1c60,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  local_1c08 = (undefined1  [8])0x13c0da;
  local_1c00 = "/|/";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_1c60,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1b30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b30,anon_var_dwarf_13775,(allocator<char> *)local_1c08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b10,anon_var_dwarf_13780,(allocator<char> *)&chr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1b00 + 0x10),anon_var_dwarf_1378b,(allocator<char> *)&is);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,anon_var_dwarf_13796,(allocator<char> *)&gs);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ab0,anon_var_dwarf_137a1,(allocator<char> *)&es);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a90,anon_var_dwarf_137ac,(allocator<char> *)&rs);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a70,anon_var_dwarf_137b7,(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>(local_1a50,anon_var_dwarf_137c2,&local_1ca4);
  std::__cxx11::string::string<std::allocator<char>>(local_1a30,anon_var_dwarf_137cd,&local_1ca5);
  std::__cxx11::string::string<std::allocator<char>>(local_1a10,anon_var_dwarf_137d8,&local_1ca6);
  std::__cxx11::string::string<std::allocator<char>>(local_19f0,anon_var_dwarf_137e3,&local_1ca7);
  std::__cxx11::string::string<std::allocator<char>>(local_19d0,anon_var_dwarf_137ee,&local_1ca8);
  std::__cxx11::string::string<std::allocator<char>>(local_19b0,anon_var_dwarf_137f9,&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>(local_1990,anon_var_dwarf_13804,&local_1caa);
  std::__cxx11::string::string<std::allocator<char>>(local_1970,anon_var_dwarf_1380f,&local_1cab);
  std::__cxx11::string::string<std::allocator<char>>(local_1950,anon_var_dwarf_1381a,&local_1cac);
  std::__cxx11::string::string<std::allocator<char>>(local_1930,anon_var_dwarf_13825,&local_1cad);
  std::__cxx11::string::string<std::allocator<char>>(local_1910,anon_var_dwarf_13830,&local_1cae);
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,anon_var_dwarf_1383b,&local_1caf);
  std::__cxx11::string::string<std::allocator<char>>(local_18d0,anon_var_dwarf_13846,&local_1cb0);
  std::__cxx11::string::string<std::allocator<char>>(local_18b0,anon_var_dwarf_13851,&local_1cb1);
  std::__cxx11::string::string<std::allocator<char>>(local_1890,anon_var_dwarf_1385c,&local_1cb2);
  std::__cxx11::string::string<std::allocator<char>>(local_1870,anon_var_dwarf_13867,&local_1cb3);
  std::__cxx11::string::string<std::allocator<char>>(local_1850,anon_var_dwarf_13872,&local_1cb4);
  std::__cxx11::string::string<std::allocator<char>>(local_1830,anon_var_dwarf_1387d,&local_1cb5);
  std::__cxx11::string::string<std::allocator<char>>(local_1810,anon_var_dwarf_13888,&local_1cb6);
  std::__cxx11::string::string<std::allocator<char>>(local_17f0,anon_var_dwarf_13893,&local_1cb7);
  std::__cxx11::string::string<std::allocator<char>>(local_17d0,anon_var_dwarf_1389e,&local_1cb8);
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,anon_var_dwarf_138a9,&local_1cb9);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,anon_var_dwarf_138b4,&local_1cba);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,anon_var_dwarf_138bf,&local_1cbb);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,anon_var_dwarf_138ca,&local_1cbc);
  std::__cxx11::string::string<std::allocator<char>>(local_1730,anon_var_dwarf_138d5,&local_1cbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,anon_var_dwarf_138e0,&local_1cbe);
  std::__cxx11::string::string<std::allocator<char>>(local_16f0,anon_var_dwarf_138eb,&local_1cbf);
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,anon_var_dwarf_138f6,&local_1cc0);
  std::__cxx11::string::string<std::allocator<char>>(local_16b0,anon_var_dwarf_13901,&local_1cc1);
  std::__cxx11::string::string<std::allocator<char>>(local_1690,anon_var_dwarf_1390c,&local_1cc2);
  std::__cxx11::string::string<std::allocator<char>>(local_1670,anon_var_dwarf_13917,&local_1cc3);
  std::__cxx11::string::string<std::allocator<char>>(local_1650,anon_var_dwarf_13922,&local_1cc4);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,anon_var_dwarf_1392d,&local_1cc5);
  std::__cxx11::string::string<std::allocator<char>>(local_1610,anon_var_dwarf_13938,&local_1cc6);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,anon_var_dwarf_13943,&local_1cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,anon_var_dwarf_1394e,&local_1cc8);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,anon_var_dwarf_13959,&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>(local_1590,anon_var_dwarf_13964,&local_1cca);
  std::__cxx11::string::string<std::allocator<char>>(local_1570,anon_var_dwarf_138d5,&local_1ccb);
  std::__cxx11::string::string<std::allocator<char>>(local_1550,anon_var_dwarf_1396f,&local_1ccc);
  std::__cxx11::string::string<std::allocator<char>>(local_1530,anon_var_dwarf_1397a,&local_1ccd);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,anon_var_dwarf_13985,&local_1cce);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,anon_var_dwarf_13990,&local_1ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,anon_var_dwarf_1399b,&local_1cd0);
  std::__cxx11::string::string<std::allocator<char>>(local_14b0,anon_var_dwarf_139a6,&local_1cd1);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,anon_var_dwarf_139b1,&local_1cd2);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,anon_var_dwarf_139bc,&local_1cd3);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,anon_var_dwarf_139c7,&local_1cd4);
  std::__cxx11::string::string<std::allocator<char>>(local_1430,anon_var_dwarf_139d2,&local_1cd5);
  std::__cxx11::string::string<std::allocator<char>>(local_1410,anon_var_dwarf_139dd,&local_1cd6);
  std::__cxx11::string::string<std::allocator<char>>(local_13f0,anon_var_dwarf_139e8,&local_1cd7);
  std::__cxx11::string::string<std::allocator<char>>(local_13d0,anon_var_dwarf_139f3,&local_1cd8);
  std::__cxx11::string::string<std::allocator<char>>(local_13b0,anon_var_dwarf_139fe,&local_1cd9);
  std::__cxx11::string::string<std::allocator<char>>(local_1390,anon_var_dwarf_13a09,&local_1cda);
  std::__cxx11::string::string<std::allocator<char>>(local_1370,anon_var_dwarf_13a14,&local_1cdb);
  std::__cxx11::string::string<std::allocator<char>>(local_1350,anon_var_dwarf_13a1f,&local_1cdc);
  std::__cxx11::string::string<std::allocator<char>>(local_1330,anon_var_dwarf_13a2a,&local_1cdd);
  std::__cxx11::string::string<std::allocator<char>>(local_1310,anon_var_dwarf_13a35,&local_1cde);
  std::__cxx11::string::string<std::allocator<char>>(local_12f0,anon_var_dwarf_13a40,&local_1cdf);
  std::__cxx11::string::string<std::allocator<char>>(local_12d0,anon_var_dwarf_13a4b,&local_1ce0);
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,anon_var_dwarf_13a56,&local_1ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_1290,anon_var_dwarf_13a61,&local_1ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_1270,anon_var_dwarf_13a6c,&local_1ce3);
  std::__cxx11::string::string<std::allocator<char>>(local_1250,anon_var_dwarf_13a77,&local_1ce4);
  std::__cxx11::string::string<std::allocator<char>>(local_1230,anon_var_dwarf_13a82,&local_1c9a);
  std::__cxx11::string::string<std::allocator<char>>(local_1210,anon_var_dwarf_13a8d,&local_1c9b);
  std::__cxx11::string::string<std::allocator<char>>(local_11f0,anon_var_dwarf_13a98,&local_1c9c);
  std::__cxx11::string::string<std::allocator<char>>(local_11d0,anon_var_dwarf_1373e,&local_1c9d);
  std::__cxx11::string::string<std::allocator<char>>(local_11b0,anon_var_dwarf_13aa3,&local_1c9e);
  std::__cxx11::string::string<std::allocator<char>>(local_1190,anon_var_dwarf_13aaf,&local_1c9f);
  std::__cxx11::string::string<std::allocator<char>>(local_1170,anon_var_dwarf_13abb,&local_1ca0);
  std::__cxx11::string::string<std::allocator<char>>(local_1150,anon_var_dwarf_13ac7,&local_1ca1);
  std::__cxx11::string::string<std::allocator<char>>(local_1130,anon_var_dwarf_13ad3,&local_1ca2);
  std::__cxx11::string::string<std::allocator<char>>(local_1110,anon_var_dwarf_13adf,&local_1ca3);
  std::__cxx11::string::string<std::allocator<char>>(local_10f0,anon_var_dwarf_13aeb,&local_1c8e);
  std::__cxx11::string::string<std::allocator<char>>(local_10d0,anon_var_dwarf_13af7,&local_1c8f);
  std::__cxx11::string::string<std::allocator<char>>(local_10b0,anon_var_dwarf_13b03,&local_1c90);
  std::__cxx11::string::string<std::allocator<char>>(local_1090,anon_var_dwarf_13b0f,&local_1c91);
  std::__cxx11::string::string<std::allocator<char>>(local_1070,anon_var_dwarf_13b1b,&local_1c92);
  std::__cxx11::string::string<std::allocator<char>>(local_1050,anon_var_dwarf_13b27,&local_1c93);
  std::__cxx11::string::string<std::allocator<char>>(local_1030,anon_var_dwarf_13b33,&local_1c94);
  std::__cxx11::string::string<std::allocator<char>>(local_1010,anon_var_dwarf_13b3f,&local_1c95);
  std::__cxx11::string::string<std::allocator<char>>(local_ff0,anon_var_dwarf_13b4b,&local_1c96);
  std::__cxx11::string::string<std::allocator<char>>(local_fd0,anon_var_dwarf_13b57,&local_1c97);
  std::__cxx11::string::string<std::allocator<char>>(local_fb0,anon_var_dwarf_13b63,&local_1c98);
  __l._M_len = 0x5d;
  __l._M_array = (iterator)local_1b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&ns,__l,&local_1c99);
  lVar2 = 0xb80;
  do {
    std::__cxx11::string::~string((string *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b30,anon_var_dwarf_13b6f,(allocator<char> *)local_1c08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b10,anon_var_dwarf_15c8f + 0xb,(allocator<char> *)&chr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1b00 + 0x10),"i",(allocator<char> *)&gs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,"1",(allocator<char> *)&es);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab0,"|",(allocator<char> *)&rs);
  std::__cxx11::string::string<std::allocator<char>>(local_1a90,"l",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>(local_1a70,"j",&local_1ca4);
  std::__cxx11::string::string<std::allocator<char>>(local_1a50,"!",&local_1ca5);
  std::__cxx11::string::string<std::allocator<char>>(local_1a30,"/",&local_1ca6);
  std::__cxx11::string::string<std::allocator<char>>(local_1a10,"\\\\",&local_1ca7);
  std::__cxx11::string::string<std::allocator<char>>(local_19f0,anon_var_dwarf_13bdb,&local_1ca8);
  std::__cxx11::string::string<std::allocator<char>>(local_19d0,anon_var_dwarf_13be7,&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>(local_19b0,anon_var_dwarf_13bf3,&local_1caa);
  std::__cxx11::string::string<std::allocator<char>>(local_1990,anon_var_dwarf_13bff,&local_1cab);
  std::__cxx11::string::string<std::allocator<char>>(local_1970,anon_var_dwarf_13c0b,&local_1cac);
  std::__cxx11::string::string<std::allocator<char>>(local_1950,anon_var_dwarf_13c17,&local_1cad);
  std::__cxx11::string::string<std::allocator<char>>(local_1930,anon_var_dwarf_13c23,&local_1cae);
  std::__cxx11::string::string<std::allocator<char>>(local_1910,anon_var_dwarf_13c2f,&local_1caf);
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,anon_var_dwarf_13c3b,&local_1cb0);
  std::__cxx11::string::string<std::allocator<char>>(local_18d0,anon_var_dwarf_13c47,&local_1cb1);
  std::__cxx11::string::string<std::allocator<char>>(local_18b0,anon_var_dwarf_13c53,&local_1cb2);
  std::__cxx11::string::string<std::allocator<char>>(local_1890,anon_var_dwarf_13c5f,&local_1cb3);
  std::__cxx11::string::string<std::allocator<char>>(local_1870,anon_var_dwarf_13c6b,&local_1cb4);
  std::__cxx11::string::string<std::allocator<char>>(local_1850,anon_var_dwarf_13c77,&local_1cb5);
  std::__cxx11::string::string<std::allocator<char>>(local_1830,anon_var_dwarf_13c83,&local_1cb6);
  std::__cxx11::string::string<std::allocator<char>>(local_1810,anon_var_dwarf_13c8f,&local_1cb7);
  std::__cxx11::string::string<std::allocator<char>>(local_17f0,anon_var_dwarf_13c9b,&local_1cb8);
  std::__cxx11::string::string<std::allocator<char>>(local_17d0,anon_var_dwarf_13ca7,&local_1cb9);
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,anon_var_dwarf_13cb3,&local_1cba);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,anon_var_dwarf_13cbf,&local_1cbb);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,anon_var_dwarf_13ccb,&local_1cbc);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,anon_var_dwarf_13cd7,&local_1cbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1730,anon_var_dwarf_13ce3,&local_1cbe);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,anon_var_dwarf_13cef,&local_1cbf);
  std::__cxx11::string::string<std::allocator<char>>(local_16f0,anon_var_dwarf_13cfb,&local_1cc0);
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,anon_var_dwarf_13d07,&local_1cc1);
  std::__cxx11::string::string<std::allocator<char>>(local_16b0,anon_var_dwarf_13d13,&local_1cc2);
  std::__cxx11::string::string<std::allocator<char>>(local_1690,anon_var_dwarf_13d1f,&local_1cc3);
  std::__cxx11::string::string<std::allocator<char>>(local_1670,anon_var_dwarf_13d2b,&local_1cc4);
  std::__cxx11::string::string<std::allocator<char>>(local_1650,anon_var_dwarf_13d37,&local_1cc5);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,anon_var_dwarf_13d43,&local_1cc6);
  std::__cxx11::string::string<std::allocator<char>>(local_1610,anon_var_dwarf_13d4f,&local_1cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,anon_var_dwarf_13d5b,&local_1cc8);
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,anon_var_dwarf_13d67,&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,anon_var_dwarf_13d73,&local_1cca);
  std::__cxx11::string::string<std::allocator<char>>(local_1590,anon_var_dwarf_13d7f,&local_1ccb);
  std::__cxx11::string::string<std::allocator<char>>(local_1570,anon_var_dwarf_13d8b,&local_1ccc);
  std::__cxx11::string::string<std::allocator<char>>(local_1550,anon_var_dwarf_13d97,&local_1ccd);
  std::__cxx11::string::string<std::allocator<char>>(local_1530,anon_var_dwarf_13da3,&local_1cce);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,anon_var_dwarf_13daf,&local_1ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,anon_var_dwarf_13dbb,&local_1cd0);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,anon_var_dwarf_13dc7,&local_1cd1);
  std::__cxx11::string::string<std::allocator<char>>(local_14b0,anon_var_dwarf_13dd3,&local_1cd2);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,anon_var_dwarf_13ddf,&local_1cd3);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,anon_var_dwarf_13deb,&local_1cd4);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,anon_var_dwarf_13df7,&local_1cd5);
  std::__cxx11::string::string<std::allocator<char>>(local_1430,anon_var_dwarf_13e03,&local_1cd6);
  std::__cxx11::string::string<std::allocator<char>>(local_1410,anon_var_dwarf_13e0f,&local_1cd7);
  std::__cxx11::string::string<std::allocator<char>>(local_13f0,anon_var_dwarf_13e1b,&local_1cd8);
  std::__cxx11::string::string<std::allocator<char>>(local_13d0,anon_var_dwarf_13e27,&local_1cd9);
  std::__cxx11::string::string<std::allocator<char>>(local_13b0,anon_var_dwarf_13e33,&local_1cda);
  std::__cxx11::string::string<std::allocator<char>>(local_1390,anon_var_dwarf_13e3f,&local_1cdb);
  std::__cxx11::string::string<std::allocator<char>>(local_1370,anon_var_dwarf_13e4b,&local_1cdc);
  std::__cxx11::string::string<std::allocator<char>>(local_1350,anon_var_dwarf_13e57,&local_1cdd);
  std::__cxx11::string::string<std::allocator<char>>(local_1330,anon_var_dwarf_13e63,&local_1cde);
  std::__cxx11::string::string<std::allocator<char>>(local_1310,anon_var_dwarf_13e6f,&local_1cdf);
  std::__cxx11::string::string<std::allocator<char>>(local_12f0,anon_var_dwarf_13e7b,&local_1ce0);
  std::__cxx11::string::string<std::allocator<char>>(local_12d0,anon_var_dwarf_13e87,&local_1ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,anon_var_dwarf_13e93,&local_1ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_1290,anon_var_dwarf_13e9f,&local_1ce3);
  std::__cxx11::string::string<std::allocator<char>>(local_1270,anon_var_dwarf_13eab,&local_1ce4);
  std::__cxx11::string::string<std::allocator<char>>(local_1250,anon_var_dwarf_13eb7,&local_1c9a);
  std::__cxx11::string::string<std::allocator<char>>(local_1230,anon_var_dwarf_13ec3,&local_1c9b);
  std::__cxx11::string::string<std::allocator<char>>(local_1210,anon_var_dwarf_13ecf,&local_1c9c);
  std::__cxx11::string::string<std::allocator<char>>(local_11f0,anon_var_dwarf_13edb,&local_1c9d);
  std::__cxx11::string::string<std::allocator<char>>(local_11d0,anon_var_dwarf_13ee7,&local_1c9e);
  std::__cxx11::string::string<std::allocator<char>>(local_11b0,anon_var_dwarf_13ef3,&local_1c9f);
  std::__cxx11::string::string<std::allocator<char>>(local_1190,anon_var_dwarf_13eff,&local_1ca0);
  std::__cxx11::string::string<std::allocator<char>>(local_1170,anon_var_dwarf_13f0b,&local_1ca1);
  std::__cxx11::string::string<std::allocator<char>>(local_1150,anon_var_dwarf_13f17,&local_1ca2);
  std::__cxx11::string::string<std::allocator<char>>(local_1130,anon_var_dwarf_13f23,&local_1ca3);
  std::__cxx11::string::string<std::allocator<char>>(local_1110,anon_var_dwarf_13f2f,&local_1c8e);
  std::__cxx11::string::string<std::allocator<char>>(local_10f0,anon_var_dwarf_13f3b,&local_1c8f);
  std::__cxx11::string::string<std::allocator<char>>(local_10d0,anon_var_dwarf_13f47,&local_1c90);
  std::__cxx11::string::string<std::allocator<char>>(local_10b0,anon_var_dwarf_13f53,&local_1c91);
  std::__cxx11::string::string<std::allocator<char>>(local_1090,anon_var_dwarf_13f5f,&local_1c92);
  std::__cxx11::string::string<std::allocator<char>>(local_1070,anon_var_dwarf_13f6b,&local_1c93);
  std::__cxx11::string::string<std::allocator<char>>(local_1050,anon_var_dwarf_13f77,&local_1c94);
  std::__cxx11::string::string<std::allocator<char>>(local_1030,anon_var_dwarf_13f83,&local_1c95);
  std::__cxx11::string::string<std::allocator<char>>(local_1010,anon_var_dwarf_13f8f,&local_1c96);
  std::__cxx11::string::string<std::allocator<char>>(local_ff0,anon_var_dwarf_13f9b,&local_1c97);
  std::__cxx11::string::string<std::allocator<char>>(local_fd0,anon_var_dwarf_13fa7,&local_1c98);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fb0,anon_var_dwarf_13fb3,(allocator<char> *)&local_1c99);
  std::__cxx11::string::string<std::allocator<char>>(local_f90,anon_var_dwarf_13fbf,&local_1c61);
  std::__cxx11::string::string<std::allocator<char>>(local_f70,anon_var_dwarf_13fcb,&local_1c62);
  std::__cxx11::string::string<std::allocator<char>>(local_f50,anon_var_dwarf_13fd7,&local_1c63);
  std::__cxx11::string::string<std::allocator<char>>(local_f30,anon_var_dwarf_13fe3,&local_1c64);
  std::__cxx11::string::string<std::allocator<char>>(local_f10,anon_var_dwarf_13fef,&local_1c65);
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,anon_var_dwarf_13ffb,&local_1c66);
  std::__cxx11::string::string<std::allocator<char>>(local_ed0,anon_var_dwarf_14007,&local_1c67);
  std::__cxx11::string::string<std::allocator<char>>(local_eb0,anon_var_dwarf_14013,&local_1c68);
  std::__cxx11::string::string<std::allocator<char>>(local_e90,anon_var_dwarf_1401f,&local_1c69);
  std::__cxx11::string::string<std::allocator<char>>(local_e70,anon_var_dwarf_1402b,&local_1c6a);
  std::__cxx11::string::string<std::allocator<char>>(local_e50,anon_var_dwarf_14037,&local_1c6b);
  std::__cxx11::string::string<std::allocator<char>>(local_e30,anon_var_dwarf_14043,&local_1c6c);
  std::__cxx11::string::string<std::allocator<char>>(local_e10,anon_var_dwarf_1404f,&local_1c6d);
  std::__cxx11::string::string<std::allocator<char>>(local_df0,anon_var_dwarf_1405b,&local_1c6e);
  std::__cxx11::string::string<std::allocator<char>>(local_dd0,anon_var_dwarf_13e4b,&local_1c6f);
  std::__cxx11::string::string<std::allocator<char>>(local_db0,anon_var_dwarf_14067,&local_1c70);
  std::__cxx11::string::string<std::allocator<char>>(local_d90,anon_var_dwarf_14073,&local_1c71);
  std::__cxx11::string::string<std::allocator<char>>(local_d70,anon_var_dwarf_1407f,&local_1c72);
  std::__cxx11::string::string<std::allocator<char>>(local_d50,anon_var_dwarf_1408b,&local_1c73);
  std::__cxx11::string::string<std::allocator<char>>(local_d30,anon_var_dwarf_14097,&local_1c74);
  std::__cxx11::string::string<std::allocator<char>>(local_d10,anon_var_dwarf_13ee7,&local_1c75);
  std::__cxx11::string::string<std::allocator<char>>(local_cf0,anon_var_dwarf_140a3,&local_1c76);
  std::__cxx11::string::string<std::allocator<char>>(local_cd0,anon_var_dwarf_140af,&local_1c77);
  std::__cxx11::string::string<std::allocator<char>>(local_cb0,anon_var_dwarf_140bb,&local_1c78);
  std::__cxx11::string::string<std::allocator<char>>(local_c90,anon_var_dwarf_140c7,&local_1c79);
  std::__cxx11::string::string<std::allocator<char>>(local_c70,anon_var_dwarf_140d3,&local_1c7a);
  std::__cxx11::string::string<std::allocator<char>>(local_c50,anon_var_dwarf_140df,&local_1c7b);
  std::__cxx11::string::string<std::allocator<char>>(local_c30,anon_var_dwarf_140eb,&local_1c7c);
  std::__cxx11::string::string<std::allocator<char>>(local_c10,anon_var_dwarf_140f7,&local_1c7d);
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,anon_var_dwarf_14103,&local_1c7e);
  std::__cxx11::string::string<std::allocator<char>>(local_bd0,anon_var_dwarf_1410f,&local_1c7f);
  std::__cxx11::string::string<std::allocator<char>>(local_bb0,anon_var_dwarf_1411b,&local_1c80);
  std::__cxx11::string::string<std::allocator<char>>(local_b90,anon_var_dwarf_14127,&local_1c81);
  std::__cxx11::string::string<std::allocator<char>>(local_b70,anon_var_dwarf_14133,&local_1c82);
  std::__cxx11::string::string<std::allocator<char>>(local_b50,anon_var_dwarf_1413f,&local_1c83);
  std::__cxx11::string::string<std::allocator<char>>(local_b30,anon_var_dwarf_13ccb,&local_1c84);
  std::__cxx11::string::string<std::allocator<char>>(local_b10,anon_var_dwarf_1414b,&local_1c85);
  std::__cxx11::string::string<std::allocator<char>>(local_af0,anon_var_dwarf_14157,&local_1c86);
  std::__cxx11::string::string<std::allocator<char>>(local_ad0,anon_var_dwarf_14163,&local_1c87);
  std::__cxx11::string::string<std::allocator<char>>(local_ab0,anon_var_dwarf_1416f,&local_1c88);
  std::__cxx11::string::string<std::allocator<char>>(local_a90,anon_var_dwarf_1417b,&local_1c89);
  std::__cxx11::string::string<std::allocator<char>>(local_a70,anon_var_dwarf_14187,&local_1c8a);
  std::__cxx11::string::string<std::allocator<char>>(local_a50,anon_var_dwarf_1378b,&local_1c8b);
  std::__cxx11::string::string<std::allocator<char>>(local_a30,anon_var_dwarf_14193,&local_1c8c);
  std::__cxx11::string::string<std::allocator<char>>(local_a10,anon_var_dwarf_1419f,&local_1c8d);
  std::__cxx11::string::string<std::allocator<char>>(local_9f0,anon_var_dwarf_141ab,&local_1c09);
  std::__cxx11::string::string<std::allocator<char>>(local_9d0,anon_var_dwarf_141b7,&local_1c0a);
  std::__cxx11::string::string<std::allocator<char>>(local_9b0,anon_var_dwarf_141c3,&local_1c0b);
  std::__cxx11::string::string<std::allocator<char>>(local_990,anon_var_dwarf_13b6f,&local_1c0c);
  std::__cxx11::string::string<std::allocator<char>>(local_970,anon_var_dwarf_141cf,&local_1c0d);
  std::__cxx11::string::string<std::allocator<char>>(local_950,anon_var_dwarf_141db,&local_1c0e);
  std::__cxx11::string::string<std::allocator<char>>(local_930,anon_var_dwarf_141e7,&local_1c0f);
  std::__cxx11::string::string<std::allocator<char>>(local_910,anon_var_dwarf_141f3,&local_1c10);
  std::__cxx11::string::string<std::allocator<char>>(local_8f0,anon_var_dwarf_141ff,&local_1c11);
  std::__cxx11::string::string<std::allocator<char>>(local_8d0,anon_var_dwarf_1420b,&local_1c12);
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,anon_var_dwarf_14217,&local_1c13);
  std::__cxx11::string::string<std::allocator<char>>(local_890,anon_var_dwarf_14223,&local_1c14);
  std::__cxx11::string::string<std::allocator<char>>(local_870,anon_var_dwarf_1422f,&local_1c15);
  std::__cxx11::string::string<std::allocator<char>>(local_850,anon_var_dwarf_1423b,&local_1c16);
  std::__cxx11::string::string<std::allocator<char>>(local_830,anon_var_dwarf_14247,&local_1c17);
  std::__cxx11::string::string<std::allocator<char>>(local_810,anon_var_dwarf_14253,&local_1c18);
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,anon_var_dwarf_1425f,&local_1c19);
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,anon_var_dwarf_1426b,&local_1c1a);
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,anon_var_dwarf_14277,&local_1c1b);
  std::__cxx11::string::string<std::allocator<char>>(local_790,anon_var_dwarf_14283,&local_1c1c);
  std::__cxx11::string::string<std::allocator<char>>(local_770,anon_var_dwarf_1428f,&local_1c1d);
  std::__cxx11::string::string<std::allocator<char>>(local_750,anon_var_dwarf_13cb3,&local_1c1e);
  std::__cxx11::string::string<std::allocator<char>>(local_730,anon_var_dwarf_1429b,&local_1c1f);
  std::__cxx11::string::string<std::allocator<char>>(local_710,anon_var_dwarf_142a7,&local_1c20);
  std::__cxx11::string::string<std::allocator<char>>(local_6f0,anon_var_dwarf_142b3,&local_1c21);
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,anon_var_dwarf_142bf,&local_1c22);
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,anon_var_dwarf_13cd7,&local_1c23);
  std::__cxx11::string::string<std::allocator<char>>(local_690,anon_var_dwarf_142cb,&local_1c24);
  std::__cxx11::string::string<std::allocator<char>>(local_670,anon_var_dwarf_142d7,&local_1c25);
  std::__cxx11::string::string<std::allocator<char>>(local_650,anon_var_dwarf_142e3,&local_1c26);
  std::__cxx11::string::string<std::allocator<char>>(local_630,anon_var_dwarf_142ef,&local_1c27);
  std::__cxx11::string::string<std::allocator<char>>(local_610,anon_var_dwarf_142fb,&local_1c28);
  std::__cxx11::string::string<std::allocator<char>>(local_5f0,anon_var_dwarf_13d43,&local_1c29);
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,anon_var_dwarf_14307,&local_1c2a);
  std::__cxx11::string::string<std::allocator<char>>(local_5b0,anon_var_dwarf_14313,&local_1c2b);
  std::__cxx11::string::string<std::allocator<char>>(local_590,anon_var_dwarf_1431f,&local_1c2c);
  std::__cxx11::string::string<std::allocator<char>>(local_570,anon_var_dwarf_1432b,&local_1c2d);
  std::__cxx11::string::string<std::allocator<char>>(local_550,anon_var_dwarf_14337,&local_1c2e);
  std::__cxx11::string::string<std::allocator<char>>(local_530,anon_var_dwarf_14343,&local_1c2f);
  std::__cxx11::string::string<std::allocator<char>>(local_510,anon_var_dwarf_1434f,&local_1c30);
  std::__cxx11::string::string<std::allocator<char>>(local_4f0,anon_var_dwarf_1435b,&local_1c31);
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,anon_var_dwarf_14367,&local_1c32);
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,anon_var_dwarf_14373,&local_1c33);
  std::__cxx11::string::string<std::allocator<char>>(local_490,anon_var_dwarf_1437f,&local_1c34);
  std::__cxx11::string::string<std::allocator<char>>(local_470,anon_var_dwarf_1438b,&local_1c35);
  std::__cxx11::string::string<std::allocator<char>>(local_450,anon_var_dwarf_14397,&local_1c36);
  std::__cxx11::string::string<std::allocator<char>>(local_430,anon_var_dwarf_143a3,&local_1c37);
  std::__cxx11::string::string<std::allocator<char>>(local_410,anon_var_dwarf_143af,&local_1c38);
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,anon_var_dwarf_143bb,&local_1c39);
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,anon_var_dwarf_143c7,&local_1c3a);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,anon_var_dwarf_13cef,&local_1c3b);
  std::__cxx11::string::string<std::allocator<char>>(local_390,anon_var_dwarf_143d3,&local_1c3c);
  std::__cxx11::string::string<std::allocator<char>>(local_370,anon_var_dwarf_143df,&local_1c3d);
  std::__cxx11::string::string<std::allocator<char>>(local_350,anon_var_dwarf_143eb,&local_1c3e);
  std::__cxx11::string::string<std::allocator<char>>(local_330,anon_var_dwarf_143f7,&local_1c3f);
  std::__cxx11::string::string<std::allocator<char>>(local_310,anon_var_dwarf_14403,&local_1c40);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,anon_var_dwarf_1440f,&local_1c41);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,anon_var_dwarf_13bdb,&local_1c42);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,anon_var_dwarf_1441b,&local_1c43);
  std::__cxx11::string::string<std::allocator<char>>(local_290,anon_var_dwarf_14427,&local_1c44);
  std::__cxx11::string::string<std::allocator<char>>(local_270,anon_var_dwarf_14433,&local_1c45);
  std::__cxx11::string::string<std::allocator<char>>(local_250,anon_var_dwarf_1443f,&local_1c46);
  std::__cxx11::string::string<std::allocator<char>>(local_230,anon_var_dwarf_1444b,&local_1c47);
  std::__cxx11::string::string<std::allocator<char>>(local_210,anon_var_dwarf_14457,&local_1c48);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,anon_var_dwarf_13635 + 4,&local_1c49)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,anon_var_dwarf_1446f,&local_1c4a);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,anon_var_dwarf_1447b,&local_1c4b);
  std::__cxx11::string::string<std::allocator<char>>(local_190,anon_var_dwarf_14487,&local_1c4c);
  std::__cxx11::string::string<std::allocator<char>>(local_170,anon_var_dwarf_14493,&local_1c4d);
  std::__cxx11::string::string<std::allocator<char>>(local_150,anon_var_dwarf_1449f,&local_1c4e);
  std::__cxx11::string::string<std::allocator<char>>(local_130,anon_var_dwarf_144ab,&local_1c4f);
  std::__cxx11::string::string<std::allocator<char>>(local_110,anon_var_dwarf_144b7,&local_1c50);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,anon_var_dwarf_144c3,&local_1c51);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,anon_var_dwarf_144cf,&local_1c52);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,anon_var_dwarf_144db,&local_1c53);
  std::__cxx11::string::string<std::allocator<char>>(local_90,anon_var_dwarf_144e7,&local_1c54);
  std::__cxx11::string::string<std::allocator<char>>(local_70,anon_var_dwarf_144f3,&local_1c55);
  std::__cxx11::string::string<std::allocator<char>>(local_50,anon_var_dwarf_13da3,&local_1c56);
  __l_00._M_len = 0xd8;
  __l_00._M_array = (iterator)local_1b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&is,__l_00,&local_1c57);
  lVar2 = 0x1ae0;
  do {
    std::__cxx11::string::~string((string *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b30,"k",(allocator<char> *)local_1c08);
  std::__cxx11::string::string<std::allocator<char>>(local_1b10,"g",(allocator<char> *)&chr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1b00 + 0x10),"q",(allocator<char> *)&es);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,"4",(allocator<char> *)&rs);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab0,"6",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>(local_1a90,"9",&local_1ca4);
  std::__cxx11::string::string<std::allocator<char>>(local_1a70,anon_var_dwarf_14547,&local_1ca5);
  std::__cxx11::string::string<std::allocator<char>>(local_1a50,anon_var_dwarf_14553,&local_1ca6);
  std::__cxx11::string::string<std::allocator<char>>(local_1a30,anon_var_dwarf_1455f,&local_1ca7);
  std::__cxx11::string::string<std::allocator<char>>(local_1a10,anon_var_dwarf_1456b,&local_1ca8);
  std::__cxx11::string::string<std::allocator<char>>(local_19f0,anon_var_dwarf_14577,&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>(local_19d0,anon_var_dwarf_14583,&local_1caa);
  std::__cxx11::string::string<std::allocator<char>>(local_19b0,anon_var_dwarf_1458f,&local_1cab);
  std::__cxx11::string::string<std::allocator<char>>(local_1990,anon_var_dwarf_1459b,&local_1cac);
  std::__cxx11::string::string<std::allocator<char>>(local_1970,anon_var_dwarf_145a7,&local_1cad);
  std::__cxx11::string::string<std::allocator<char>>(local_1950,anon_var_dwarf_145b3,&local_1cae);
  std::__cxx11::string::string<std::allocator<char>>(local_1930,anon_var_dwarf_145bf,&local_1caf);
  std::__cxx11::string::string<std::allocator<char>>(local_1910,anon_var_dwarf_145cb,&local_1cb0);
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,anon_var_dwarf_145d7,&local_1cb1);
  std::__cxx11::string::string<std::allocator<char>>(local_18d0,anon_var_dwarf_145e3,&local_1cb2);
  std::__cxx11::string::string<std::allocator<char>>(local_18b0,anon_var_dwarf_145ef,&local_1cb3);
  std::__cxx11::string::string<std::allocator<char>>(local_1890,anon_var_dwarf_145fb,&local_1cb4);
  std::__cxx11::string::string<std::allocator<char>>(local_1870,anon_var_dwarf_14607,&local_1cb5);
  std::__cxx11::string::string<std::allocator<char>>(local_1850,anon_var_dwarf_14613,&local_1cb6);
  std::__cxx11::string::string<std::allocator<char>>(local_1830,anon_var_dwarf_1461f,&local_1cb7);
  std::__cxx11::string::string<std::allocator<char>>(local_1810,anon_var_dwarf_1462b,&local_1cb8);
  std::__cxx11::string::string<std::allocator<char>>(local_17f0,anon_var_dwarf_14637,&local_1cb9);
  std::__cxx11::string::string<std::allocator<char>>(local_17d0,anon_var_dwarf_14643,&local_1cba);
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,anon_var_dwarf_1464f,&local_1cbb);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,anon_var_dwarf_1465b,&local_1cbc);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,anon_var_dwarf_14667,&local_1cbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,anon_var_dwarf_14673,&local_1cbe);
  std::__cxx11::string::string<std::allocator<char>>(local_1730,anon_var_dwarf_1467f,&local_1cbf);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,anon_var_dwarf_1468b,&local_1cc0);
  std::__cxx11::string::string<std::allocator<char>>(local_16f0,anon_var_dwarf_14697,&local_1cc1);
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,anon_var_dwarf_146a3,&local_1cc2);
  std::__cxx11::string::string<std::allocator<char>>(local_16b0,anon_var_dwarf_146af,&local_1cc3);
  std::__cxx11::string::string<std::allocator<char>>(local_1690,anon_var_dwarf_146bb,&local_1cc4);
  std::__cxx11::string::string<std::allocator<char>>(local_1670,anon_var_dwarf_146c7,&local_1cc5);
  std::__cxx11::string::string<std::allocator<char>>(local_1650,anon_var_dwarf_146d3,&local_1cc6);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,anon_var_dwarf_146df,&local_1cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_1610,anon_var_dwarf_146eb,&local_1cc8);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,anon_var_dwarf_146f7,&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,anon_var_dwarf_14703,&local_1cca);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,anon_var_dwarf_1470f,&local_1ccb);
  std::__cxx11::string::string<std::allocator<char>>(local_1590,anon_var_dwarf_1471b,&local_1ccc);
  std::__cxx11::string::string<std::allocator<char>>(local_1570,anon_var_dwarf_14727,&local_1ccd);
  std::__cxx11::string::string<std::allocator<char>>(local_1550,anon_var_dwarf_14733,&local_1cce);
  std::__cxx11::string::string<std::allocator<char>>(local_1530,anon_var_dwarf_1473f,&local_1ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,anon_var_dwarf_1474b,&local_1cd0);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,anon_var_dwarf_14757,&local_1cd1);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,anon_var_dwarf_14763,&local_1cd2);
  std::__cxx11::string::string<std::allocator<char>>(local_14b0,anon_var_dwarf_1476f,&local_1cd3);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,anon_var_dwarf_1477b,&local_1cd4);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,anon_var_dwarf_14787,&local_1cd5);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,anon_var_dwarf_14793,&local_1cd6);
  std::__cxx11::string::string<std::allocator<char>>(local_1430,anon_var_dwarf_1479f,&local_1cd7);
  std::__cxx11::string::string<std::allocator<char>>(local_1410,anon_var_dwarf_147ab,&local_1cd8);
  std::__cxx11::string::string<std::allocator<char>>(local_13f0,anon_var_dwarf_147b7,&local_1cd9);
  std::__cxx11::string::string<std::allocator<char>>(local_13d0,anon_var_dwarf_14547,&local_1cda);
  std::__cxx11::string::string<std::allocator<char>>(local_13b0,anon_var_dwarf_147c3,&local_1cdb);
  std::__cxx11::string::string<std::allocator<char>>(local_1390,anon_var_dwarf_147cf,&local_1cdc);
  std::__cxx11::string::string<std::allocator<char>>(local_1370,anon_var_dwarf_147db,&local_1cdd);
  std::__cxx11::string::string<std::allocator<char>>(local_1350,anon_var_dwarf_147e7,&local_1cde);
  std::__cxx11::string::string<std::allocator<char>>(local_1330,anon_var_dwarf_147f3,&local_1cdf);
  std::__cxx11::string::string<std::allocator<char>>(local_1310,anon_var_dwarf_147ff,&local_1ce0);
  std::__cxx11::string::string<std::allocator<char>>(local_12f0,anon_var_dwarf_14607,&local_1ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_12d0,anon_var_dwarf_1480b,&local_1ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,"@",&local_1ce3);
  __l_01._M_len = 0x45;
  __l_01._M_array = (iterator)local_1b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&gs,__l_01,(allocator_type *)&local_1ce4);
  lVar2 = 0x880;
  do {
    std::__cxx11::string::~string((string *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b30,anon_var_dwarf_14823,(allocator<char> *)local_1c08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b10,anon_var_dwarf_1482f,(allocator<char> *)&chr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1b00 + 0x10),anon_var_dwarf_1483b,(allocator<char> *)&rs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,"e",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab0,"3",&local_1ca4);
  std::__cxx11::string::string<std::allocator<char>>(local_1a90,"u",&local_1ca5);
  std::__cxx11::string::string<std::allocator<char>>(local_1a70,anon_var_dwarf_1486b,&local_1ca6);
  std::__cxx11::string::string<std::allocator<char>>(local_1a50,anon_var_dwarf_14877,&local_1ca7);
  std::__cxx11::string::string<std::allocator<char>>(local_1a30,anon_var_dwarf_14883,&local_1ca8);
  std::__cxx11::string::string<std::allocator<char>>(local_1a10,anon_var_dwarf_1488f,&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>(local_19f0,anon_var_dwarf_1489b,&local_1caa);
  std::__cxx11::string::string<std::allocator<char>>(local_19d0,anon_var_dwarf_148a7,&local_1cab);
  std::__cxx11::string::string<std::allocator<char>>(local_19b0,anon_var_dwarf_148b3,&local_1cac);
  std::__cxx11::string::string<std::allocator<char>>(local_1990,anon_var_dwarf_148bf,&local_1cad);
  std::__cxx11::string::string<std::allocator<char>>(local_1970,anon_var_dwarf_148cb,&local_1cae);
  std::__cxx11::string::string<std::allocator<char>>(local_1950,anon_var_dwarf_148d7,&local_1caf);
  std::__cxx11::string::string<std::allocator<char>>(local_1930,anon_var_dwarf_148e3,&local_1cb0);
  std::__cxx11::string::string<std::allocator<char>>(local_1910,anon_var_dwarf_148ef,&local_1cb1);
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,anon_var_dwarf_148fb,&local_1cb2);
  std::__cxx11::string::string<std::allocator<char>>(local_18d0,anon_var_dwarf_14907,&local_1cb3);
  std::__cxx11::string::string<std::allocator<char>>(local_18b0,anon_var_dwarf_14913,&local_1cb4);
  std::__cxx11::string::string<std::allocator<char>>(local_1890,anon_var_dwarf_1491f,&local_1cb5);
  std::__cxx11::string::string<std::allocator<char>>(local_1870,anon_var_dwarf_1492b,&local_1cb6);
  std::__cxx11::string::string<std::allocator<char>>(local_1850,anon_var_dwarf_14937,&local_1cb7);
  std::__cxx11::string::string<std::allocator<char>>(local_1830,anon_var_dwarf_14943,&local_1cb8);
  std::__cxx11::string::string<std::allocator<char>>(local_1810,anon_var_dwarf_1494f,&local_1cb9);
  std::__cxx11::string::string<std::allocator<char>>(local_17f0,anon_var_dwarf_1495b,&local_1cba);
  std::__cxx11::string::string<std::allocator<char>>(local_17d0,anon_var_dwarf_14967,&local_1cbb);
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,anon_var_dwarf_14973,&local_1cbc);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,anon_var_dwarf_1497f,&local_1cbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,anon_var_dwarf_1498b,&local_1cbe);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,anon_var_dwarf_14997,&local_1cbf);
  std::__cxx11::string::string<std::allocator<char>>(local_1730,anon_var_dwarf_149a3,&local_1cc0);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,anon_var_dwarf_149af,&local_1cc1);
  std::__cxx11::string::string<std::allocator<char>>(local_16f0,anon_var_dwarf_149bb,&local_1cc2);
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,anon_var_dwarf_149c7,&local_1cc3);
  std::__cxx11::string::string<std::allocator<char>>(local_16b0,anon_var_dwarf_149d3,&local_1cc4);
  std::__cxx11::string::string<std::allocator<char>>(local_1690,anon_var_dwarf_149df,&local_1cc5);
  std::__cxx11::string::string<std::allocator<char>>(local_1670,anon_var_dwarf_149eb,&local_1cc6);
  std::__cxx11::string::string<std::allocator<char>>(local_1650,anon_var_dwarf_149f7,&local_1cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,anon_var_dwarf_14a03,&local_1cc8);
  std::__cxx11::string::string<std::allocator<char>>(local_1610,anon_var_dwarf_14a0f,&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,anon_var_dwarf_14a1b,&local_1cca);
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,anon_var_dwarf_14a27,&local_1ccb);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,anon_var_dwarf_14a33,&local_1ccc);
  std::__cxx11::string::string<std::allocator<char>>(local_1590,anon_var_dwarf_14a3f,&local_1ccd);
  std::__cxx11::string::string<std::allocator<char>>(local_1570,anon_var_dwarf_14a4b,&local_1cce);
  std::__cxx11::string::string<std::allocator<char>>(local_1550,anon_var_dwarf_14a57,&local_1ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_1530,anon_var_dwarf_14a63,&local_1cd0);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,anon_var_dwarf_14a6f,&local_1cd1);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,anon_var_dwarf_14a7b,&local_1cd2);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,anon_var_dwarf_14a87,&local_1cd3);
  std::__cxx11::string::string<std::allocator<char>>(local_14b0,anon_var_dwarf_14a93,&local_1cd4);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,anon_var_dwarf_14a9f,&local_1cd5);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,anon_var_dwarf_14aab,&local_1cd6);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,anon_var_dwarf_14ab7,&local_1cd7);
  std::__cxx11::string::string<std::allocator<char>>(local_1430,anon_var_dwarf_14ac3,&local_1cd8);
  std::__cxx11::string::string<std::allocator<char>>(local_1410,anon_var_dwarf_14acf,&local_1cd9);
  std::__cxx11::string::string<std::allocator<char>>(local_13f0,anon_var_dwarf_14adb,&local_1cda);
  std::__cxx11::string::string<std::allocator<char>>(local_13d0,anon_var_dwarf_14ae7,&local_1cdb);
  std::__cxx11::string::string<std::allocator<char>>(local_13b0,anon_var_dwarf_14af3,&local_1cdc);
  std::__cxx11::string::string<std::allocator<char>>(local_1390,anon_var_dwarf_14aff,&local_1cdd);
  std::__cxx11::string::string<std::allocator<char>>(local_1370,anon_var_dwarf_14b0b,&local_1cde);
  std::__cxx11::string::string<std::allocator<char>>(local_1350,anon_var_dwarf_14b17,&local_1cdf);
  std::__cxx11::string::string<std::allocator<char>>(local_1330,anon_var_dwarf_14b23,&local_1ce0);
  std::__cxx11::string::string<std::allocator<char>>(local_1310,anon_var_dwarf_14b2f,&local_1ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_12f0,anon_var_dwarf_14b3b,&local_1ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_12d0,anon_var_dwarf_14b47,&local_1ce3);
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,anon_var_dwarf_14b53,&local_1ce4);
  std::__cxx11::string::string<std::allocator<char>>(local_1290,anon_var_dwarf_14b5f,&local_1c9a);
  std::__cxx11::string::string<std::allocator<char>>(local_1270,anon_var_dwarf_14b6b,&local_1c9b);
  std::__cxx11::string::string<std::allocator<char>>(local_1250,anon_var_dwarf_14b77,&local_1c9c);
  std::__cxx11::string::string<std::allocator<char>>(local_1230,anon_var_dwarf_14b83,&local_1c9d);
  std::__cxx11::string::string<std::allocator<char>>(local_1210,anon_var_dwarf_14b8f,&local_1c9e);
  std::__cxx11::string::string<std::allocator<char>>(local_11f0,anon_var_dwarf_14b9b,&local_1c9f);
  std::__cxx11::string::string<std::allocator<char>>(local_11d0,anon_var_dwarf_14ba7,&local_1ca0);
  std::__cxx11::string::string<std::allocator<char>>(local_11b0,anon_var_dwarf_14bb3,&local_1ca1);
  std::__cxx11::string::string<std::allocator<char>>(local_1190,anon_var_dwarf_14823,&local_1ca2);
  std::__cxx11::string::string<std::allocator<char>>(local_1170,anon_var_dwarf_14bbf,&local_1ca3);
  std::__cxx11::string::string<std::allocator<char>>(local_1150,anon_var_dwarf_14bcb,&local_1c8e);
  std::__cxx11::string::string<std::allocator<char>>(local_1130,anon_var_dwarf_14bd7,&local_1c8f);
  std::__cxx11::string::string<std::allocator<char>>(local_1110,anon_var_dwarf_14be3,&local_1c90);
  std::__cxx11::string::string<std::allocator<char>>(local_10f0,anon_var_dwarf_14bef,&local_1c91);
  std::__cxx11::string::string<std::allocator<char>>(local_10d0,anon_var_dwarf_14bfb,&local_1c92);
  std::__cxx11::string::string<std::allocator<char>>(local_10b0,anon_var_dwarf_14c07,&local_1c93);
  std::__cxx11::string::string<std::allocator<char>>(local_1090,anon_var_dwarf_14c13,&local_1c94);
  std::__cxx11::string::string<std::allocator<char>>(local_1070,anon_var_dwarf_14c1f,&local_1c95);
  std::__cxx11::string::string<std::allocator<char>>(local_1050,anon_var_dwarf_14c2b,&local_1c96);
  std::__cxx11::string::string<std::allocator<char>>(local_1030,anon_var_dwarf_14c37,&local_1c97);
  std::__cxx11::string::string<std::allocator<char>>(local_1010,anon_var_dwarf_14c43,&local_1c98);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff0,anon_var_dwarf_14c4f,(allocator<char> *)&local_1c99);
  std::__cxx11::string::string<std::allocator<char>>(local_fd0,anon_var_dwarf_14c5b,&local_1c61);
  std::__cxx11::string::string<std::allocator<char>>(local_fb0,anon_var_dwarf_14c67,&local_1c62);
  std::__cxx11::string::string<std::allocator<char>>(local_f90,anon_var_dwarf_14c73,&local_1c63);
  std::__cxx11::string::string<std::allocator<char>>(local_f70,anon_var_dwarf_14c7f,&local_1c64);
  std::__cxx11::string::string<std::allocator<char>>(local_f50,anon_var_dwarf_14c8b,&local_1c65);
  std::__cxx11::string::string<std::allocator<char>>(local_f30,anon_var_dwarf_14c97,&local_1c66);
  std::__cxx11::string::string<std::allocator<char>>(local_f10,anon_var_dwarf_14ca3,&local_1c67);
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,anon_var_dwarf_14caf,&local_1c68);
  std::__cxx11::string::string<std::allocator<char>>(local_ed0,anon_var_dwarf_14cbb,&local_1c69);
  std::__cxx11::string::string<std::allocator<char>>(local_eb0,anon_var_dwarf_14cc7,&local_1c6a);
  std::__cxx11::string::string<std::allocator<char>>(local_e90,anon_var_dwarf_14cd3,&local_1c6b);
  std::__cxx11::string::string<std::allocator<char>>(local_e70,anon_var_dwarf_14cdf,&local_1c6c);
  std::__cxx11::string::string<std::allocator<char>>(local_e50,anon_var_dwarf_14ceb,&local_1c6d);
  std::__cxx11::string::string<std::allocator<char>>(local_e30,anon_var_dwarf_14cf7,&local_1c6e);
  std::__cxx11::string::string<std::allocator<char>>(local_e10,anon_var_dwarf_14d03,&local_1c6f);
  std::__cxx11::string::string<std::allocator<char>>(local_df0,anon_var_dwarf_14d0f,&local_1c70);
  std::__cxx11::string::string<std::allocator<char>>(local_dd0,anon_var_dwarf_14d1b,&local_1c71);
  std::__cxx11::string::string<std::allocator<char>>(local_db0,anon_var_dwarf_14d27,&local_1c72);
  std::__cxx11::string::string<std::allocator<char>>(local_d90,anon_var_dwarf_14d33,&local_1c73);
  std::__cxx11::string::string<std::allocator<char>>(local_d70,anon_var_dwarf_14d3f,&local_1c74);
  std::__cxx11::string::string<std::allocator<char>>(local_d50,anon_var_dwarf_14937,&local_1c75);
  std::__cxx11::string::string<std::allocator<char>>(local_d30,anon_var_dwarf_14d4b,&local_1c76);
  std::__cxx11::string::string<std::allocator<char>>(local_d10,anon_var_dwarf_14d57,&local_1c77);
  std::__cxx11::string::string<std::allocator<char>>(local_cf0,anon_var_dwarf_14d63,&local_1c78);
  std::__cxx11::string::string<std::allocator<char>>(local_cd0,anon_var_dwarf_14d6f,&local_1c79);
  std::__cxx11::string::string<std::allocator<char>>(local_cb0,anon_var_dwarf_14d7b,&local_1c7a);
  std::__cxx11::string::string<std::allocator<char>>(local_c90,anon_var_dwarf_14d87,&local_1c7b);
  std::__cxx11::string::string<std::allocator<char>>(local_c70,anon_var_dwarf_14d93,&local_1c7c);
  std::__cxx11::string::string<std::allocator<char>>(local_c50,anon_var_dwarf_14d9f,&local_1c7d);
  std::__cxx11::string::string<std::allocator<char>>(local_c30,anon_var_dwarf_14dab,&local_1c7e);
  std::__cxx11::string::string<std::allocator<char>>(local_c10,anon_var_dwarf_14db7,&local_1c7f);
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,anon_var_dwarf_14dc3,&local_1c80);
  std::__cxx11::string::string<std::allocator<char>>(local_bd0,anon_var_dwarf_14dcf,&local_1c81);
  std::__cxx11::string::string<std::allocator<char>>(local_bb0,anon_var_dwarf_14ddb,&local_1c82);
  std::__cxx11::string::string<std::allocator<char>>(local_b90,anon_var_dwarf_14de7,&local_1c83);
  std::__cxx11::string::string<std::allocator<char>>(local_b70,anon_var_dwarf_14df3,&local_1c84);
  std::__cxx11::string::string<std::allocator<char>>(local_b50,anon_var_dwarf_14dff,&local_1c85);
  std::__cxx11::string::string<std::allocator<char>>(local_b30,anon_var_dwarf_14e0b,&local_1c86);
  std::__cxx11::string::string<std::allocator<char>>(local_b10,anon_var_dwarf_14e17,&local_1c87);
  std::__cxx11::string::string<std::allocator<char>>(local_af0,anon_var_dwarf_14e23,&local_1c88);
  std::__cxx11::string::string<std::allocator<char>>(local_ad0,anon_var_dwarf_14e2f,&local_1c89);
  std::__cxx11::string::string<std::allocator<char>>(local_ab0,anon_var_dwarf_14e3b,&local_1c8a);
  std::__cxx11::string::string<std::allocator<char>>(local_a90,anon_var_dwarf_14e47,&local_1c8b);
  std::__cxx11::string::string<std::allocator<char>>(local_a70,anon_var_dwarf_14e53,&local_1c8c);
  __l_02._M_len = 0x87;
  __l_02._M_array = (iterator)local_1b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&es,__l_02,(allocator_type *)&local_1c8d);
  lVar2 = 0x10c0;
  do {
    std::__cxx11::string::~string((string *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b30,anon_var_dwarf_15207 + 0x77,(allocator<char> *)local_1c08);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b10,anon_var_dwarf_14e6b,(allocator<char> *)&chr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1b00 + 0x10),"r",(allocator<char> *)&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ad0,anon_var_dwarf_14e83,&local_1ca4);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab0,anon_var_dwarf_14e8f,&local_1ca5);
  std::__cxx11::string::string<std::allocator<char>>(local_1a90,anon_var_dwarf_14e9b,&local_1ca6);
  std::__cxx11::string::string<std::allocator<char>>(local_1a70,anon_var_dwarf_14ea7,&local_1ca7);
  std::__cxx11::string::string<std::allocator<char>>(local_1a50,anon_var_dwarf_14eb3,&local_1ca8);
  std::__cxx11::string::string<std::allocator<char>>(local_1a30,anon_var_dwarf_14ebf,&local_1ca9);
  std::__cxx11::string::string<std::allocator<char>>(local_1a10,anon_var_dwarf_14ecb,&local_1caa);
  std::__cxx11::string::string<std::allocator<char>>(local_19f0,anon_var_dwarf_14ed7,&local_1cab);
  std::__cxx11::string::string<std::allocator<char>>(local_19d0,anon_var_dwarf_14ee3,&local_1cac);
  std::__cxx11::string::string<std::allocator<char>>(local_19b0,anon_var_dwarf_14eef,&local_1cad);
  std::__cxx11::string::string<std::allocator<char>>(local_1990,anon_var_dwarf_14efb,&local_1cae);
  std::__cxx11::string::string<std::allocator<char>>(local_1970,anon_var_dwarf_14f07,&local_1caf);
  std::__cxx11::string::string<std::allocator<char>>(local_1950,anon_var_dwarf_14f13,&local_1cb0);
  std::__cxx11::string::string<std::allocator<char>>(local_1930,anon_var_dwarf_14f1f,&local_1cb1);
  std::__cxx11::string::string<std::allocator<char>>(local_1910,anon_var_dwarf_14f2b,&local_1cb2);
  std::__cxx11::string::string<std::allocator<char>>(local_18f0,anon_var_dwarf_14f37,&local_1cb3);
  std::__cxx11::string::string<std::allocator<char>>(local_18d0,anon_var_dwarf_14f43,&local_1cb4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_18b0,anon_var_dwarf_15c2f + 4,&local_1cb5);
  std::__cxx11::string::string<std::allocator<char>>(local_1890,anon_var_dwarf_14f5b,&local_1cb6);
  std::__cxx11::string::string<std::allocator<char>>(local_1870,anon_var_dwarf_14f67,&local_1cb7);
  std::__cxx11::string::string<std::allocator<char>>(local_1850,anon_var_dwarf_14f73,&local_1cb8);
  std::__cxx11::string::string<std::allocator<char>>(local_1830,anon_var_dwarf_14f7f,&local_1cb9);
  std::__cxx11::string::string<std::allocator<char>>(local_1810,anon_var_dwarf_14f8b,&local_1cba);
  std::__cxx11::string::string<std::allocator<char>>(local_17f0,anon_var_dwarf_14f97,&local_1cbb);
  std::__cxx11::string::string<std::allocator<char>>(local_17d0,anon_var_dwarf_14fa3,&local_1cbc);
  std::__cxx11::string::string<std::allocator<char>>(local_17b0,anon_var_dwarf_14faf,&local_1cbd);
  std::__cxx11::string::string<std::allocator<char>>(local_1790,anon_var_dwarf_14fbb,&local_1cbe);
  std::__cxx11::string::string<std::allocator<char>>(local_1770,anon_var_dwarf_14fc7,&local_1cbf);
  std::__cxx11::string::string<std::allocator<char>>(local_1750,anon_var_dwarf_14fd3,&local_1cc0);
  std::__cxx11::string::string<std::allocator<char>>(local_1730,anon_var_dwarf_14fdf,&local_1cc1);
  std::__cxx11::string::string<std::allocator<char>>(local_1710,anon_var_dwarf_14feb,&local_1cc2);
  std::__cxx11::string::string<std::allocator<char>>(local_16f0,anon_var_dwarf_14ff7,&local_1cc3);
  std::__cxx11::string::string<std::allocator<char>>(local_16d0,anon_var_dwarf_15003,&local_1cc4);
  std::__cxx11::string::string<std::allocator<char>>(local_16b0,anon_var_dwarf_1500f,&local_1cc5);
  std::__cxx11::string::string<std::allocator<char>>(local_1690,anon_var_dwarf_1501b,&local_1cc6);
  std::__cxx11::string::string<std::allocator<char>>(local_1670,anon_var_dwarf_15027,&local_1cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_1650,anon_var_dwarf_15033,&local_1cc8);
  std::__cxx11::string::string<std::allocator<char>>(local_1630,anon_var_dwarf_1503f,&local_1cc9);
  std::__cxx11::string::string<std::allocator<char>>(local_1610,anon_var_dwarf_1504b,&local_1cca);
  std::__cxx11::string::string<std::allocator<char>>(local_15f0,anon_var_dwarf_15057,&local_1ccb);
  std::__cxx11::string::string<std::allocator<char>>(local_15d0,anon_var_dwarf_15063,&local_1ccc);
  std::__cxx11::string::string<std::allocator<char>>(local_15b0,anon_var_dwarf_1506f,&local_1ccd);
  std::__cxx11::string::string<std::allocator<char>>(local_1590,anon_var_dwarf_1507b,&local_1cce);
  std::__cxx11::string::string<std::allocator<char>>(local_1570,anon_var_dwarf_15087,&local_1ccf);
  std::__cxx11::string::string<std::allocator<char>>(local_1550,anon_var_dwarf_15093,&local_1cd0);
  std::__cxx11::string::string<std::allocator<char>>(local_1530,anon_var_dwarf_1509f,&local_1cd1);
  std::__cxx11::string::string<std::allocator<char>>(local_1510,anon_var_dwarf_150ab,&local_1cd2);
  std::__cxx11::string::string<std::allocator<char>>(local_14f0,anon_var_dwarf_150b7,&local_1cd3);
  std::__cxx11::string::string<std::allocator<char>>(local_14d0,anon_var_dwarf_150c3,&local_1cd4);
  std::__cxx11::string::string<std::allocator<char>>(local_14b0,anon_var_dwarf_150cf,&local_1cd5);
  std::__cxx11::string::string<std::allocator<char>>(local_1490,anon_var_dwarf_150db,&local_1cd6);
  std::__cxx11::string::string<std::allocator<char>>(local_1470,anon_var_dwarf_150e7,&local_1cd7);
  std::__cxx11::string::string<std::allocator<char>>(local_1450,anon_var_dwarf_1500f,&local_1cd8);
  std::__cxx11::string::string<std::allocator<char>>(local_1430,anon_var_dwarf_150f3,&local_1cd9);
  std::__cxx11::string::string<std::allocator<char>>(local_1410,anon_var_dwarf_150ff,&local_1cda);
  std::__cxx11::string::string<std::allocator<char>>(local_13f0,anon_var_dwarf_1510b,&local_1cdb);
  std::__cxx11::string::string<std::allocator<char>>(local_13d0,anon_var_dwarf_15117,&local_1cdc);
  std::__cxx11::string::string<std::allocator<char>>(local_13b0,anon_var_dwarf_15123,&local_1cdd);
  std::__cxx11::string::string<std::allocator<char>>(local_1390,anon_var_dwarf_1512f,&local_1cde);
  std::__cxx11::string::string<std::allocator<char>>(local_1370,anon_var_dwarf_1513b,&local_1cdf);
  std::__cxx11::string::string<std::allocator<char>>(local_1350,anon_var_dwarf_15147,&local_1ce0);
  std::__cxx11::string::string<std::allocator<char>>(local_1330,anon_var_dwarf_15153,&local_1ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_1310,anon_var_dwarf_1515f,&local_1ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_12f0,anon_var_dwarf_1516b,&local_1ce3);
  std::__cxx11::string::string<std::allocator<char>>(local_12d0,anon_var_dwarf_15177,&local_1ce4);
  std::__cxx11::string::string<std::allocator<char>>(local_12b0,anon_var_dwarf_15183,&local_1c9a);
  std::__cxx11::string::string<std::allocator<char>>(local_1290,anon_var_dwarf_1518f,&local_1c9b);
  std::__cxx11::string::string<std::allocator<char>>(local_1270,anon_var_dwarf_1519b,&local_1c9c);
  std::__cxx11::string::string<std::allocator<char>>(local_1250,anon_var_dwarf_151a7,&local_1c9d);
  std::__cxx11::string::string<std::allocator<char>>(local_1230,anon_var_dwarf_151b3,&local_1c9e);
  std::__cxx11::string::string<std::allocator<char>>(local_1210,anon_var_dwarf_151bf,&local_1c9f);
  std::__cxx11::string::string<std::allocator<char>>(local_11f0,anon_var_dwarf_151cb,&local_1ca0);
  std::__cxx11::string::string<std::allocator<char>>(local_11d0,anon_var_dwarf_151d7,&local_1ca1);
  std::__cxx11::string::string<std::allocator<char>>(local_11b0,anon_var_dwarf_151e3,&local_1ca2);
  __l_03._M_len = 0x4d;
  __l_03._M_array = (iterator)local_1b30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&rs,__l_03,(allocator_type *)&local_1ca3);
  lVar2 = 0x980;
  do {
    std::__cxx11::string::~string((string *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b30,&ns);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_1b30 + 0x18),&is);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b00,&gs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1ae8,&es);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1ad0,&rs);
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)local_1b30;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&s,__l_04,(allocator_type *)local_1c08);
  lVar2 = 0x60;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b30 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  uVar3 = 0;
  do {
    if (uVar3 == 5) {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&rs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&es);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&gs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&is);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ns);
      return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1c60;
    }
    pbVar1 = s.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar3].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = s.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__cxx11::string::string((string *)&chr,(string *)pbVar4);
      switch(uVar3 & 0xffffffff) {
      case 0:
        local_1c08 = (undefined1  [8])0x13c0da;
        std::__cxx11::string::string((string *)&local_1c00,(string *)&chr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30,
                   (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c08);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c60,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30);
        break;
      case 1:
        local_1c08 = (undefined1  [8])0x13b542;
        std::__cxx11::string::string((string *)&local_1c00,(string *)&chr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30,
                   (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c08);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c60,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30);
        break;
      case 2:
        local_1c08 = (undefined1  [8])0x13c378;
        std::__cxx11::string::string((string *)&local_1c00,(string *)&chr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30,
                   (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c08);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c60,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30);
        break;
      case 3:
        local_1c08 = (undefined1  [8])0x13c533;
        std::__cxx11::string::string((string *)&local_1c00,(string *)&chr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30,
                   (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c08);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c60,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30);
        break;
      case 4:
        local_1c08 = (undefined1  [8])0x13b9c5;
        std::__cxx11::string::string((string *)&local_1c00,(string *)&chr);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30,
                   (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c08);
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c60,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b30);
        break;
      default:
        goto switchD_0010ccc0_default;
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1b30);
      std::__cxx11::string::~string((string *)&local_1c00);
switchD_0010ccc0_default:
      std::__cxx11::string::~string((string *)&chr);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::vector<std::pair<std::string, std::string>> GetDefaultMap()
{
	std::vector<std::pair<std::string, std::string>> map;

	map.push_back(std::pair("N", "/[()[]]/"));
	map.push_back(std::pair("N", "\U000000f1"));
	map.push_back(std::pair("N", "|\\|"));
	map.push_back(std::pair("N", "\U00000245\U0000002f"));
	map.push_back(std::pair("N", "/IJ"));
	map.push_back(std::pair("N", "/|/"));

	std::vector<std::string> ns = { "\U000004c5", "\U000003a0", "\U00000418", "\U0001d427", "\U0001d45b", "\U0001d48f", "\U0001d4c3", "\U0001d4f7", "\U0001d52b", "\U0001d55f", "\U0001d593", "\U0001d5c7", "\U0001d5fb", "\U0001d62f", "\U0001d663", "\U0001d697", "\U00000578", "\U0000057c", "\U0000ff2e", "\U00002115", "\U0001d40d", "\U0001d441", "\U0001d475", "\U0001d4a9", "\U0001d4dd", "\U0001d511", "\U0001d579", "\U0001d5ad", "\U0001d5e1", "\U0001d615", "\U0001d649", "\U0001d67d", "\U0000039d", "\U0001d6b4", "\U0001d6ee", "\U0001d728", "\U0001d762", "\U0001d79c", "\U0000a4e0", "\U00000143", "\U00000145", "\U00000147", "\U0000014b", "\U0000019d", "\U000001f8", "\U00000220", "\U0000039d", "\U00001e44", "\U00001e46", "\U00001e48", "\U00001e4a", "\U000020a6", "\U00001f20", "\U00001f21", "\U00001f22", "\U00001f23", "\U00001f24", "\U00001f25", "\U00001f26", "\U00001f27", "\U00001f74", "\U00001f75", "\U00001f90", "\U00001f91", "\U00001f92", "\U00001f93", "\U00001f94", "\U00001f95", "\U00001f96", "\U00001f97", "\U00001fc2", "\U00001fc3", "\U00001fc4", "\U00001fc6", "\U00001fc7", "\U000000f1", "\U00000144", "\U00000146", "\U00000148", "\U00000149", "\U0000014a", "\U0000019e", "\U000001f9", "\U00000235", "\U00000272", "\U00000273", "\U00000274", "\U00001d70", "\U00001d87", "\U00001e45", "\U00001e47", "\U00001e49", "\U00001e4b" };
	std::vector<std::string> is = { "\U00001ec8", "\U00000079", "\U00000069", "\U00000031", "\U0000007c", "\U0000006c", "\U0000006a", "\U00000021", "\U0000002f", "\U0000005c\U0000005c", "\U0000ff49", "\U000000a1", "\U00002170", "\U00002139", "\U00002148", "\U0001d422", "\U0001d456", "\U0001d48a", "\U0001d4be", "\U0001d4f2", "\U0001d526", "\U0001d55a", "\U0001d58e", "\U0001d5c2", "\U0001d5f6", "\U0001d62a", "\U0001d65e", "\U0001d692", "\U00000131", "\U0001d6a4", "\U0000026a", "\U00000269", "\U000003b9", "\U00001fbe", "\U0000037a", "\U0001d6ca", "\U0001d704", "\U0001d73e", "\U0001d778", "\U0001d7b2", "\U00000456", "\U000024be", "\U0000a647", "\U000004cf", "\U0000ab75", "\U000013a5", "\U00000263", "\U00001d8c", "\U0000ff59", "\U0001d432", "\U0001d466", "\U0001d49a", "\U0001d4ce", "\U0001d502", "\U0001d536", "\U0001d56a", "\U0001d59e", "\U0001d5d2", "\U0001d606", "\U0001d63a", "\U0001d66e", "\U0001d6a2", "\U0000028f", "\U00001eff", "\U0000ab5a", "\U000003b3", "\U0000213d", "\U0001d6c4", "\U0001d6fe", "\U0001d738", "\U0001d772", "\U0001d7ac", "\U00000443", "\U000004af", "\U000010e7", "\U0000ff39", "\U0001d418", "\U0001d44c", "\U0001d480", "\U0001d4b4", "\U0001d4e8", "\U0001d51c", "\U0001d550", "\U0001d584", "\U0001d5b8", "\U0001d5ec", "\U0001d620", "\U0001d654", "\U0001d688", "\U000003a5", "\U000003d2", "\U0001d6bc", "\U0001d6f6", "\U0001d730", "\U0001d76a", "\U0001d7a4", "\U00002ca8", "\U00000423", "\U000004ae", "\U000013a9", "\U000013bd", "\U0000a4ec", "\U00000176", "\U00000178", "\U000001b3", "\U00000232", "\U0000024e", "\U0000028f", "\U00001e8e", "\U00001ef2", "\U00001ef4", "\U00001ef6", "\U00001ef8", "\U0000ff39", "\U000000cc", "\U000000cd", "\U000000ce", "\U000000cf", "\U00000128", "\U0000012a", "\U0000012c", "\U0000012e", "\U00000130", "\U00000196", "\U00000197", "\U000001cf", "\U00000208", "\U0000020a", "\U0000026a", "\U0000038a", "\U00000390", "\U00000399", "\U000003aa", "\U00000406", "\U0000040d", "\U00000418", "\U00000419", "\U000004e2", "\U000004e4", "\U00001e2c", "\U00001e2e", "\U00001ec8", "\U00001eca", "\U00001fd8", "\U00001fd9", "\U00002160", "\U0000ff29", "\U000030a7", "\U000030a8", "\U0000ff6a", "\U0000ff74", "\U000000ec", "\U000000ed", "\U000000ee", "\U000000ef", "\U00000129", "\U0000012b", "\U0000012d", "\U0000012f", "\U00000131", "\U000001d0", "\U00000209", "\U0000020b", "\U00000268", "\U00000269", "\U00000365", "\U000003af", "\U000003ca", "\U00000438", "\U00000439", "\U00000456", "\U0000045d", "\U000004e3", "\U000004e5", "\U00001e2d", "\U00001e2f", "\U00001ec9", "\U00001ecb", "\U00001f30", "\U00001f31", "\U00001f32", "\U00001f33", "\U00001f34", "\U00001f35", "\U00001f36", "\U00001f37", "\U00001f76", "\U00001f77", "\U00001fbe", "\U00001fd0", "\U00001fd1", "\U00001fd2", "\U00001fd3", "\U00001fd6", "\U00001fd7", "\U0000ff49", "\U00001d85", "\U00001e37", "\U00001e39", "\U00001e3b", "\U00001e3d", "\U000000fd", "\U000000ff", "\U00000177", "\U000001b4", "\U00000233", "\U0000024f", "\U0000028e", "\U000002b8", "\U00001e8f", "\U00001e99", "\U00001ef3", "\U00001ef5", "\U00001ef7", "\U00001ef9", "\U0000ff59" };
	std::vector<std::string> gs = { "\U0000006b", "\U00000067", "\U00000071", "\U00000034", "\U00000036", "\U00000039", "\U0000011f", "\U00000d6b", "\U0000ff47", "\U0000210a", "\U0001d420", "\U0001d454", "\U0001d488", "\U0001d4f0", "\U0001d524", "\U0001d558", "\U0001d58c", "\U0001d5c0", "\U0001d5f4", "\U0001d628", "\U0001d65c", "\U0001d690", "\U00000261", "\U00001d83", "\U0000018d", "\U00000581", "\U0001d406", "\U0001d43a", "\U0001d46e", "\U0001d4a2", "\U0001d4d6", "\U0001d50a", "\U0001d53e", "\U0001d572", "\U0001d5a6", "\U0001d5da", "\U00004e48", "\U0001d60e", "\U0001d642", "\U0001d676", "\U0000050c", "\U000013c0", "\U000013f3", "\U0000a4d6", "\U0000011c", "\U0000011e", "\U00000120", "\U00000122", "\U00000193", "\U000001e4", "\U000001e6", "\U000001f4", "\U0000029b", "\U00000393", "\U00000413", "\U00001e20", "\U0000ff27", "\U000013b6", "\U0000011d", "\U0000011f", "\U00000121", "\U00000123", "\U000001e5", "\U000001e7", "\U000001f5", "\U00000260", "\U00000261", "\U00000262", "\U00000040" };
	std::vector<std::string> es = { "\U00001ec0", "\U000003a3", "\U0000039e", "\U00000065", "\U00000033", "\U00000075", "\U0000212e", "\U0000ff45", "\U0000212f", "\U00002147", "\U0001d41e", "\U0001d452", "\U0001d486", "\U0001d4ee", "\U0001d522", "\U0001d556", "\U0001d58a", "\U0001d5be", "\U0001d5f2", "\U0001d626", "\U0001d65a", "\U0001d68e", "\U0000ab32", "\U00000435", "\U000004bd", "\U000022ff", "\U0000ff25", "\U00002130", "\U0001d404", "\U0001d438", "\U0001d46c", "\U0001d4d4", "\U0001d508", "\U0001d53c", "\U0001d570", "\U0001d5a4", "\U0001d5d8", "\U0001d60c", "\U0001d640", "\U0001d674", "\U00000395", "\U0001d6ac", "\U0001d6e6", "\U0001d720", "\U0001d75a", "\U0001d794", "\U00000415", "\U00002d39", "\U000013ac", "\U0000a4f0", "\U000000c8", "\U000000c9", "\U000000ca", "\U000000cb", "\U00000112", "\U00000114", "\U00000116", "\U00000118", "\U0000011a", "\U0000018e", "\U00000190", "\U00000204", "\U00000206", "\U00000228", "\U00000246", "\U00000388", "\U0000042d", "\U000004ec", "\U00001e14", "\U00001e16", "\U00001e18", "\U00001e1a", "\U00001e1c", "\U00001eb8", "\U00001eba", "\U00001ebc", "\U00001ebe", "\U00001ec0", "\U00001ec2", "\U00001ec4", "\U00001ec6", "\U00001f18", "\U00001f19", "\U00001f1a", "\U00001f1b", "\U00001f1c", "\U00001f1d", "\U00001fc8", "\U00001fc9", "\U000000e8", "\U000000e9", "\U000000ea", "\U000000eb", "\U00000113", "\U00000115", "\U00000117", "\U00000119", "\U0000011b", "\U0000018f", "\U00000205", "\U00000207", "\U00000229", "\U00000247", "\U00000258", "\U0000025b", "\U0000025c", "\U0000025d", "\U0000025e", "\U00000364", "\U000003ad", "\U000003b5", "\U00000435", "\U0000044d", "\U000004ed", "\U00001e15", "\U00001e17", "\U00001e19", "\U00001e1b", "\U00001e1d", "\U00001eb9", "\U00001ebb", "\U00001ebd", "\U00001ebf", "\U00001ec1", "\U00001ec3", "\U00001ec5", "\U00001ec7", "\U00001f10", "\U00001f11", "\U00001f12", "\U00001f13", "\U00001f14", "\U00001f15", "\U00001f72", "\U00001f73" };
	std::vector<std::string> rs = { "\U00000403", "\U0000042f", "\U00000072", "\U0001d42b", "\U0001d45f", "\U0001d493", "\U0001d4c7", "\U0001d4fb", "\U0001d52f", "\U0001d563", "\U0001d597", "\U0001d5cb", "\U0001d5ff", "\U0001d633", "\U0001d667", "\U0001d69b", "\U0000ab47", "\U0000ab48", "\U00001d26", "\U00002c85", "\U00000433", "\U0000ab81", "\U0000211b", "\U0000211c", "\U0000211d", "\U0001d411", "\U0001d445", "\U0001d479", "\U0001d4e1", "\U0001d57d", "\U0001d5b1", "\U0001d5e5", "\U0001d619", "\U0001d64d", "\U0001d681", "\U000001a6", "\U000013a1", "\U000013d2", "\U000104b4", "\U00001587", "\U0000a4e3", "\U00000154", "\U00000156", "\U00000158", "\U00000210", "\U00000212", "\U0000024c", "\U00000280", "\U00000281", "\U00001e58", "\U00001e5a", "\U00001e5c", "\U00001e5e", "\U00002c64", "\U0000ff32", "\U000013a1", "\U00000155", "\U00000157", "\U00000159", "\U00000211", "\U00000213", "\U0000024d", "\U00000279", "\U0000027a", "\U0000027b", "\U0000027c", "\U0000027d", "\U000016b1", "\U00001875", "\U00001d72", "\U00001d73", "\U00001d89", "\U00001e59", "\U00001e5b", "\U00001e5d", "\U00001e5f", "\U0000ff52" };

	std::vector<std::vector<std::string>> s = { ns, is, gs, es, rs };

	for (auto x = 0;x < 5;x++) {
		for (auto chr : s[x]) {
			switch (x) {
				case 0: map.push_back(std::pair("N", chr)); break;
				case 1: map.push_back(std::pair("I", chr)); break;
				case 2: map.push_back(std::pair("G", chr)); break;
				case 3: map.push_back(std::pair("E", chr)); break;
				case 4: map.push_back(std::pair("R", chr)); break;
			}
		}
	}

	return map;
}